

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

void * OpenLibrary(string *metricsLibraryName)

{
  char *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  string check;
  void *ret;
  allocator local_31;
  string local_30 [32];
  void *local_10;
  
  local_10 = (void *)0x0;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    local_10 = (void *)dlopen(uVar3,1);
  }
  else {
    if (local_10 == (void *)0x0) {
      local_10 = (void *)dlopen(cMDLibFileName,1);
    }
    pcVar1 = cMDLibFileName;
    if (local_10 == (void *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,pcVar1,&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      std::__cxx11::string::operator+=(local_30,".1");
      uVar3 = std::__cxx11::string::c_str();
      local_10 = (void *)dlopen(uVar3,1);
      std::__cxx11::string::~string(local_30);
    }
    if (local_10 == (void *)0x0) {
      local_10 = (void *)dlopen("libmd.so",1);
    }
  }
  return local_10;
}

Assistant:

static void* OpenLibrary( const std::string& metricsLibraryName )
{
    void* ret = NULL;
    if( !metricsLibraryName.empty() )
    {
        ret = dlopen(metricsLibraryName.c_str(), RTLD_LAZY | RTLD_LOCAL);
    }
    else
    {
        if( ret == NULL )
        {
            ret = dlopen(cMDLibFileName, RTLD_LAZY | RTLD_LOCAL);
        }
#if !defined(__APPLE__)
        if (ret == NULL)
        {
            // try adding an explicit soversion
            std::string check(cMDLibFileName); check += ".1";
            ret = dlopen(check.c_str(), RTLD_LAZY | RTLD_LOCAL);
        }
        if( ret == NULL )
        {
            // old alternate name, may eventually be removed
            ret = dlopen("libmd.so", RTLD_LAZY | RTLD_LOCAL);
        }
#endif
    }
    return ret;
}